

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  size_t val_;
  ostream *os_;
  bool local_5ba;
  exception *e;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  byte local_47b;
  byte local_47a;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  undefined1 local_430 [8];
  ostream os;
  undefined1 local_238 [4];
  int pstatus;
  Parg pg;
  char **argv_local;
  int argc_local;
  
  pg.similar_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  OB::Parg::Parg((Parg *)local_238,argc,argv);
  iVar2 = program_options((Parg *)local_238);
  if (iVar2 < 1) {
    if (iVar2 < 0) {
      argv_local._4_4_ = 1;
    }
    else {
      uVar3 = std::numeric_limits<unsigned_long>::max();
      OB::Term::ostream::ostream((ostream *)local_430,(ostream *)&std::cout,2,uVar3);
      OB::Term::ostream::line_wrap((ostream *)local_430,false);
      std::allocator<char>::allocator();
      local_47a = 0;
      local_47b = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"line-wrap",&local_451);
      bVar1 = OB::Parg::get<bool>((Parg *)local_238,&local_450);
      local_5ba = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_47a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"auto-wrap",&local_479);
        local_47b = 1;
        local_5ba = OB::Parg::get<bool>((Parg *)local_238,&local_478);
      }
      if ((local_47b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_478);
      }
      if ((local_47a & 1) != 0) {
        std::allocator<char>::~allocator(&local_479);
      }
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      if (local_5ba != false) {
        OB::Term::ostream::line_wrap((ostream *)local_430,true);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"auto-wrap",&local_4a1);
        bVar1 = OB::Parg::get<bool>((Parg *)local_238,&local_4a0);
        OB::Term::ostream::auto_wrap((ostream *)local_430,bVar1);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c8,"first-wrap",&local_4c9);
        bVar1 = OB::Parg::get<bool>((Parg *)local_238,&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::allocator<char>::~allocator(&local_4c9);
        if (bVar1) {
          OB::Term::ostream::first_wrap((ostream *)local_430,false);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"width",&local_4f1);
        bVar1 = OB::Parg::find((Parg *)local_238,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_518,"width",&local_519);
          uVar3 = OB::Parg::get<unsigned_long>((Parg *)local_238,&local_518);
          OB::Term::ostream::width((ostream *)local_430,uVar3);
          std::__cxx11::string::~string((string *)&local_518);
          std::allocator<char>::~allocator(&local_519);
        }
        else {
          bVar1 = OB::Term::is_term(1);
          if (bVar1) {
            val_ = OB::Term::width(1);
            OB::Term::ostream::width((ostream *)local_430,val_);
          }
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"ansi",&local_541);
      bVar1 = OB::Parg::get<bool>((Parg *)local_238,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        OB::Term::ostream::escape_codes((ostream *)local_430,false);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"white-space",&local_569);
      bVar1 = OB::Parg::get<bool>((Parg *)local_238,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        OB::Term::ostream::white_space((ostream *)local_430,false);
      }
      OB::Parg::get_stdin_abi_cxx11_(&local_590,(Parg *)local_238);
      os_ = std::operator<<((ostream *)local_430,(string *)&local_590);
      OB::Term::iomanip::operator<<(os_,(flush *)((long)&e + 7));
      std::__cxx11::string::~string((string *)&local_590);
      OB::Term::ostream::~ostream((ostream *)local_430);
      argv_local._4_4_ = 0;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  os._472_4_ = 1;
  OB::Parg::~Parg((Parg *)local_238);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  Parg pg {argc, argv};
  int pstatus {program_options(pg)};
  if (pstatus > 0) return 0;
  if (pstatus < 0) return 1;

  try
  {
    OB::Term::ostream os {std::cout};

    os.line_wrap(false);

    if (pg.get<bool>("line-wrap") || pg.get<bool>("auto-wrap"))
    {
      os.line_wrap(true);
      os.auto_wrap(pg.get<bool>("auto-wrap"));

      if (pg.get<bool>("first-wrap"))
      {
        os.first_wrap(false);
      }

      if (pg.find("width"))
      {
        os.width(pg.get<std::size_t>("width"));
      }
      else
      {
        if (OB::Term::is_term(STDOUT_FILENO))
        {
          os.width(OB::Term::width(STDOUT_FILENO));
        }
      }
    }

    if (! pg.get<bool>("ansi"))
    {
      os.escape_codes(false);
    }

    if (! pg.get<bool>("white-space"))
    {
      os.white_space(false);
    }

    os
    << pg.get_stdin()
    << OB::Term::iomanip::flush();
  }
  catch(std::exception const& e)
  {
    std::cerr << "Error: " << e.what() << "\n";
  }
  catch(...)
  {
    std::cerr << "Error: an unexpected error occurred\n";
  }

  return 0;
}